

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O2

int SetMotorRelativeIM483I(IM483I *pIM483I,int val,BOOL bForce)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  char *__s;
  int writebuflen;
  char recvbuf [512];
  char sendbuf [512];
  
  uVar2 = 0x7fffff;
  if (val < 0x7fffff) {
    uVar2 = val;
  }
  uVar6 = 0xff800001;
  if (-0x7fffff < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  if (bForce == 0) {
    uVar3 = (int)uVar6 - pIM483I->LastRval;
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    uVar3 = pIM483I->ThresholdRval;
    uVar1 = -uVar3;
    if (0 < (int)uVar3) {
      uVar1 = uVar3;
    }
    if (uVar2 < uVar1) {
      return 0;
    }
  }
  memset(sendbuf,0,0x200);
  sprintf(sendbuf,"R%d\r",uVar6);
  sVar5 = strlen(sendbuf);
  writebuflen = (int)sVar5;
  iVar4 = WriteDataIM483I(pIM483I,(uint8 *)sendbuf,writebuflen,pIM483I->bytedelayus);
  if (iVar4 == 0) {
    if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,(long)writebuflen,1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    mSleep(0x14);
    if (pIM483I->bCheckState != 0) {
      memset(recvbuf,0,0x200);
      iVar4 = ReadAllRS232Port(&pIM483I->RS232Port,(uint8 *)recvbuf,writebuflen + 1);
      if (iVar4 != 0) {
        __s = "Error reading data from a IM483I. ";
        goto LAB_00116f83;
      }
      if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf,(long)(writebuflen + 1),1,(FILE *)pIM483I->pfSaveFile);
        fflush((FILE *)pIM483I->pfSaveFile);
      }
      iVar4 = strncmp(recvbuf,sendbuf,(long)writebuflen);
      if ((iVar4 != 0) || (recvbuf[writebuflen] != '\n')) {
        puts("Error reading data from a IM483I : Invalid data. ");
        return 4;
      }
    }
    pIM483I->LastRval = (int)uVar6;
    iVar4 = 0;
  }
  else {
    __s = "Error writing data to a IM483I. ";
LAB_00116f83:
    puts(__s);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

inline int SetMotorRelativeIM483I(IM483I* pIM483I, int val, BOOL bForce)
{
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	val = max(min(val, (int)MAX_INDEX_IM483I), -(int)MAX_INDEX_IM483I);

	// The requested value is only applied if it is slightly different from the current value.
	if ((!bForce)&&(abs(val-pIM483I->LastRval) < abs(pIM483I->ThresholdRval))) return EXIT_SUCCESS;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "R%d\r", val);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a IM483I. \n");
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(20);

	if (pIM483I->bCheckState)
	{
		// Should echo and add \n...

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sendbuflen+1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a IM483I. \n");
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if ((strncmp(recvbuf, sendbuf, sendbuflen) != 0)||(recvbuf[recvbuflen-1] != '\n'))
		{
			printf("Error reading data from a IM483I : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
	}

	// Update last known value.
	pIM483I->LastRval = val;

	return EXIT_SUCCESS;
}